

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float __thiscall
tcu::ConstPixelBufferAccess::sample2DCompare
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float ref,float s,float t
          ,IVec3 *offset)

{
  WrapMode WVar1;
  float fVar2;
  int iVar3;
  Vec4 local_54;
  float local_44;
  float local_40;
  float v;
  float u;
  bool isFixedPointDepth;
  IVec3 *offset_local;
  float t_local;
  float s_local;
  float ref_local;
  FilterMode filter_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *this_local;
  
  _u = offset;
  offset_local._0_4_ = t;
  offset_local._4_4_ = s;
  t_local = ref;
  s_local = (float)filter;
  _ref_local = sampler;
  sampler_local = (Sampler *)this;
  v._3_1_ = isFixedPointDepthTextureFormat(&this->m_format);
  fVar2 = offset_local._4_4_;
  local_40 = offset_local._4_4_;
  local_44 = offset_local._0_4_;
  if ((_ref_local->normalizedCoords & 1U) != 0) {
    WVar1 = _ref_local->wrapS;
    iVar3 = Vector<int,_3>::x(&this->m_size);
    local_40 = unnormalize(WVar1,fVar2,iVar3);
    fVar2 = offset_local._0_4_;
    WVar1 = _ref_local->wrapT;
    iVar3 = Vector<int,_3>::y(&this->m_size);
    local_44 = unnormalize(WVar1,fVar2,iVar3);
  }
  if (s_local == 0.0) {
    sampleNearest2D((tcu *)&local_54,this,_ref_local,local_40,local_44,_u);
    this_local._4_4_ =
         execCompare(&local_54,_ref_local->compare,_ref_local->compareChannel,t_local,
                     (bool)(v._3_1_ & 1));
  }
  else if (s_local == 1.4013e-45) {
    this_local._4_4_ =
         sampleLinear2DCompare(this,_ref_local,t_local,local_40,local_44,_u,(bool)(v._3_1_ & 1));
  }
  else {
    this_local._4_4_ = 0.0;
  }
  return this_local._4_4_;
}

Assistant:

float ConstPixelBufferAccess::sample2DCompare (const Sampler& sampler, Sampler::FilterMode filter, float ref, float s, float t, const IVec3& offset) const
{
	// check selected layer exists
	// \note offset.xy is XY offset, offset.z is the selected layer
	DE_ASSERT(de::inBounds(offset.z(), 0, m_size.z()));

	// Format information for comparison function
	const bool isFixedPointDepth = isFixedPointDepthTextureFormat(m_format);

	// Non-normalized coordinates.
	float u = s;
	float v = t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, m_size.x());
		v = unnormalize(sampler.wrapT, t, m_size.y());
	}

	switch (filter)
	{
		case Sampler::NEAREST:	return execCompare(sampleNearest2D(*this, sampler, u, v, offset), sampler.compare, sampler.compareChannel, ref, isFixedPointDepth);
		case Sampler::LINEAR:	return sampleLinear2DCompare(*this, sampler, ref, u, v, offset, isFixedPointDepth);
		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}